

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void normalizeLines(XML_Char *s)

{
  char cVar1;
  char *pcVar2;
  
  while( true ) {
    if (*s == '\0') {
      return;
    }
    if (*s == '\r') break;
    s = s + 1;
  }
  cVar1 = '\r';
  pcVar2 = s;
  do {
    if (cVar1 == '\r') {
      *s = '\n';
      if (pcVar2[1] == '\n') {
        pcVar2 = pcVar2 + 2;
      }
      else {
        pcVar2 = pcVar2 + 1;
      }
    }
    else {
      pcVar2 = pcVar2 + 1;
      *s = cVar1;
    }
    s = s + 1;
    cVar1 = *pcVar2;
  } while (cVar1 != '\0');
  *s = '\0';
  return;
}

Assistant:

static void FASTCALL
normalizeLines(XML_Char *s) {
  XML_Char *p;
  for (;; s++) {
    if (*s == XML_T('\0'))
      return;
    if (*s == 0xD)
      break;
  }
  p = s;
  do {
    if (*s == 0xD) {
      *p++ = 0xA;
      if (*++s == 0xA)
        s++;
    } else
      *p++ = *s++;
  } while (*s);
  *p = XML_T('\0');
}